

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O2

void __thiscall
HD44780AnalyzerResults::GenerateFrameTabularText
          (HD44780AnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  size_t sVar1;
  HD44780AnalyzerResults *this_00;
  Frame frame;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char s1 [256];
  char number_str [128];
  char s2 [256];
  
  AnalyzerResults::ClearTabularText();
  Frame::Frame(&frame);
  AnalyzerResults::GetFrame((ulonglong)number_str);
  frame = (Frame)number_str[0];
  cStack_2c7 = number_str[1];
  cStack_2c6 = number_str[2];
  cStack_2c5 = number_str[3];
  cStack_2c4 = number_str[4];
  cStack_2c3 = number_str[5];
  cStack_2c2 = number_str[6];
  cStack_2c1 = number_str[7];
  Frame::~Frame((Frame *)number_str);
  AnalyzerHelpers::GetNumberString(number_str._16_8_,display_base,8,number_str,0x80);
  if ((number_str._32_2_ & 0x200) == 0) {
    builtin_strncpy(s1,"Write ",7);
  }
  else {
    builtin_strncpy(s1,"Read ",6);
  }
  sVar1 = strlen(s1);
  if ((number_str._32_2_ & 0x100) == 0) {
    builtin_strncpy(s1 + sVar1,"Command ",9);
  }
  else {
    builtin_strncpy(s1 + sVar1,"Data ",6);
  }
  this_00 = (HD44780AnalyzerResults *)s1;
  strcat((char *)this_00,number_str);
  HD44780Decode(this_00,&frame,s2,display_base);
  sVar1 = strlen(s1);
  (s1 + sVar1)[0] = ' ';
  (s1 + sVar1)[1] = '(';
  s1[sVar1 + 2] = '\0';
  strcat(s1,s2);
  sVar1 = strlen(s1);
  (s1 + sVar1)[0] = ')';
  (s1 + sVar1)[1] = '\0';
  AnalyzerResults::AddTabularText((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    char s1[ 256 ], s2[ 256 ];
    Frame frame;

    frame = GetFrame( frame_index );

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    // AddResultString( s1 );

    AddTabularText( s1 );
}